

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentFactoredStates.cpp
# Opt level: O2

void __thiscall
MADPComponentFactoredStates::~MADPComponentFactoredStates(MADPComponentFactoredStates *this)

{
  reference ppSVar1;
  iterator __position;
  uint uVar2;
  _Rb_tree<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::pair<std::vector<unsigned_int,std::allocator<unsigned_int>>const,State*>,std::_Select1st<std::pair<std::vector<unsigned_int,std::allocator<unsigned_int>>const,State*>>,std::less<std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::allocator<std::pair<std::vector<unsigned_int,std::allocator<unsigned_int>>const,State*>>>
  *this_00;
  
  this->_vptr_MADPComponentFactoredStates = (_func_int **)&PTR__MADPComponentFactoredStates_0061e158
  ;
  for (uVar2 = 0;
      (long)(this->_m_stateFactors).
            super__Vector_base<StateFactorDiscrete_*,_std::allocator<StateFactorDiscrete_*>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(this->_m_stateFactors).
            super__Vector_base<StateFactorDiscrete_*,_std::allocator<StateFactorDiscrete_*>_>.
            _M_impl.super__Vector_impl_data._M_start >> 3 != (ulong)uVar2; uVar2 = uVar2 + 1) {
    ppSVar1 = std::vector<StateFactorDiscrete_*,_std::allocator<StateFactorDiscrete_*>_>::at
                        (&this->_m_stateFactors,(ulong)uVar2);
    if (*ppSVar1 != (value_type)0x0) {
      (*((*ppSVar1)->super_NamedDescribedEntity)._vptr_NamedDescribedEntity[1])();
    }
  }
  if (this->_m_initialStateDistribution != (FactoredStateDistribution *)0x0) {
    (*(this->_m_initialStateDistribution->super_StateDistribution)._vptr_StateDistribution[1])();
  }
  while (this_00 = (_Rb_tree<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::pair<std::vector<unsigned_int,std::allocator<unsigned_int>>const,State*>,std::_Select1st<std::pair<std::vector<unsigned_int,std::allocator<unsigned_int>>const,State*>>,std::less<std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::allocator<std::pair<std::vector<unsigned_int,std::allocator<unsigned_int>>const,State*>>>
                    *)this->_m_jointStatesMap, *(size_t *)(this_00 + 0x28) != 0) {
    __position._M_node = *(_Base_ptr *)(this_00 + 0x18);
    if (__position._M_node[1]._M_right != (_Base_ptr)0x0) {
      (**(code **)(*(long *)__position._M_node[1]._M_right + 8))();
      this_00 = (_Rb_tree<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::pair<std::vector<unsigned_int,std::allocator<unsigned_int>>const,State*>,std::_Select1st<std::pair<std::vector<unsigned_int,std::allocator<unsigned_int>>const,State*>>,std::less<std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::allocator<std::pair<std::vector<unsigned_int,std::allocator<unsigned_int>>const,State*>>>
                 *)this->_m_jointStatesMap;
      __position._M_node = *(_Base_ptr *)(this_00 + 0x18);
    }
    std::
    _Rb_tree<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::pair<std::vector<unsigned_int,std::allocator<unsigned_int>>const,State*>,std::_Select1st<std::pair<std::vector<unsigned_int,std::allocator<unsigned_int>>const,State*>>,std::less<std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::allocator<std::pair<std::vector<unsigned_int,std::allocator<unsigned_int>>const,State*>>>
    ::erase_abi_cxx11_(this_00,__position);
  }
  std::
  _Rb_tree<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_State_*>,_std::_Select1st<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_State_*>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_State_*>_>_>
  ::~_Rb_tree((_Rb_tree<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_State_*>,_std::_Select1st<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_State_*>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_State_*>_>_>
               *)this_00);
  operator_delete(this_00,0x30);
  if (this->_m_stepSize != (size_t *)0x0) {
    operator_delete__(this->_m_stepSize);
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
             &this->_m_allStateFactorScope);
  std::_Vector_base<StateFactorDiscrete_*,_std::allocator<StateFactorDiscrete_*>_>::~_Vector_base
            (&(this->_m_stateFactors).
              super__Vector_base<StateFactorDiscrete_*,_std::allocator<StateFactorDiscrete_*>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->_m_sfacDomainSizes).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

MADPComponentFactoredStates::~MADPComponentFactoredStates()
{
    for(Index i=0;i!=_m_stateFactors.size();++i)
        delete _m_stateFactors.at(i);
    delete _m_initialStateDistribution;

    while( !_m_jointStatesMap->empty() )
    {
        delete (*_m_jointStatesMap->begin()).second;
        _m_jointStatesMap->erase( _m_jointStatesMap->begin() );
    }
    delete _m_jointStatesMap;
    delete [] _m_stepSize;
}